

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

string * __thiscall helics::InputInfo::getInjectionType_abi_cxx11_(InputInfo *this)

{
  string *__str;
  string *this_00;
  pointer psVar1;
  size_t __n;
  int iVar2;
  const_iterator __begin3;
  pointer psVar3;
  string_t local_60;
  data local_40;
  
  this_00 = &this->inputType;
  if ((this->inputType)._M_string_length == 0) {
    psVar3 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      __str = &psVar3->type;
      __n = (psVar3->type)._M_string_length;
      do {
        if (((psVar3->type)._M_string_length != __n) ||
           ((__n != 0 &&
            (iVar2 = bcmp((psVar3->type)._M_dataplus._M_p,(__str->_M_dataplus)._M_p,__n), iVar2 != 0
            )))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'[');
          psVar3 = (this->source_info).
                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar1 = (this->source_info).
                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar3 != psVar1) {
            do {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_40,&psVar3->type);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::dump(&local_60,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_40,-1,' ',true,hex);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_40);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(this_00,local_60._M_dataplus._M_p,local_60._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(this_00,',');
              psVar3 = psVar3 + 1;
            } while (psVar3 != psVar1);
          }
          (this->inputType)._M_dataplus._M_p[(this->inputType)._M_string_length - 1] = ']';
          return this_00;
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,__str);
    }
  }
  return this_00;
}

Assistant:

const std::string& InputInfo::getInjectionType() const
{
    if (inputType.empty()) {
        if (!source_info.empty()) {
            bool allTheSame{true};
            for (const auto& src : source_info) {
                if (src.type != source_info.front().type) {
                    allTheSame = false;
                    break;
                }
            }
            if (allTheSame) {
                inputType = source_info.front().type;
            } else {
                inputType.push_back('[');
                for (const auto& src : source_info) {
                    inputType.append(generateJsonQuotedString(src.type));
                    inputType.push_back(',');
                }
                inputType.back() = ']';
            }
        }
    }
    return inputType;
}